

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SizePolicy.cpp
# Opt level: O1

uint PrimePolicy::GetPrime(uint min,int *modFunctionIndex)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uint unaff_R14D;
  uint uVar5;
  bool bVar6;
  float fVar7;
  
  if (min == 0) {
    *modFunctionIndex = 3;
    unaff_R14D = 0x11;
  }
  else {
    puVar1 = primes;
    uVar4 = 0;
    bVar6 = false;
    do {
      uVar5 = *puVar1;
      if (min <= uVar5) {
        *modFunctionIndex = (int)uVar4;
        unaff_R14D = uVar5;
        break;
      }
      bVar6 = 0x49 < uVar4;
      uVar4 = uVar4 + 1;
      puVar1 = puVar1 + 1;
    } while (uVar4 != 0x4b);
    if (bVar6) {
      *modFunctionIndex = 0x4b;
      uVar5 = min | 1;
      unaff_R14D = min;
      if (uVar5 < 0x7fffffff) {
        do {
          fVar7 = (float)uVar5;
          if (fVar7 < 0.0) {
            fVar7 = sqrtf(fVar7);
          }
          else {
            fVar7 = SQRT(fVar7);
          }
          iVar2 = (int)(long)fVar7;
          bVar6 = iVar2 < 3;
          if (2 < iVar2) {
            uVar4 = 3;
            do {
              if ((int)((ulong)uVar5 % uVar4) == 0) goto LAB_0069b914;
              uVar3 = (int)uVar4 + 2;
              uVar4 = (ulong)uVar3;
              bVar6 = iVar2 < (int)uVar3;
            } while ((int)uVar3 <= iVar2);
          }
          if (bVar6) {
            return uVar5;
          }
LAB_0069b914:
          bVar6 = uVar5 < 0x7ffffffd;
          uVar5 = uVar5 + 2;
        } while (bVar6);
      }
    }
  }
  return unaff_R14D;
}

Assistant:

uint
PrimePolicy::GetPrime(uint min, int *modFunctionIndex)
{
    if (min <= 0)
    {
        *modFunctionIndex = 3;
        AssertMsg(primes[3] == 17, "Update modFunctionIndex for 17");
        return 17;
    }

    for (int i = 0; i < sizeof(primes)/sizeof(uint); i++)
    {
        uint prime = primes[i];
        if (prime >= min)
        {
            *modFunctionIndex = i;
            return prime;
        }
    }

    *modFunctionIndex = UNKNOWN_MOD_INDEX;
    //outside of our predefined table.
    //compute the hard way.
    for (uint i = (min | 1); i < 0x7FFFFFFF; i += 2)
    {
        if (IsPrime(i))
        {
            return i;
        }
    }
    return min;
}